

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes_hash.cpp
# Opt level: O3

void hashAndFillAes1Rx4<true>(void *scratchpad,size_t scratchpadSize,void *hash,void *fill_state)

{
  bool bVar1;
  void *pvVar2;
  bool bVar4;
  undefined4 *puVar5;
  undefined4 *puVar6;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Da_03;
  undefined4 extraout_XMM0_Da_04;
  undefined4 extraout_XMM0_Da_05;
  undefined4 extraout_XMM0_Da_06;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Db_06;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dc_05;
  undefined4 extraout_XMM0_Dc_06;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  undefined4 extraout_XMM0_Dd_03;
  undefined4 extraout_XMM0_Dd_04;
  undefined4 extraout_XMM0_Dd_05;
  undefined4 extraout_XMM0_Dd_06;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  rx_vec_i128 in;
  rx_vec_i128 in_00;
  rx_vec_i128 in_01;
  rx_vec_i128 in_02;
  rx_vec_i128 in_03;
  rx_vec_i128 in_04;
  rx_vec_i128 in_05;
  rx_vec_i128 in_06;
  rx_vec_i128 in_07;
  rx_vec_i128 in_08;
  rx_vec_i128 in_09;
  rx_vec_i128 in_10;
  rx_vec_i128 in_11;
  rx_vec_i128 in_12;
  rx_vec_i128 in_13;
  rx_vec_i128 key;
  rx_vec_i128 key_00;
  rx_vec_i128 key_01;
  rx_vec_i128 key_02;
  rx_vec_i128 key_03;
  rx_vec_i128 key_04;
  rx_vec_i128 key_05;
  rx_vec_i128 key_06;
  rx_vec_i128 key_07;
  rx_vec_i128 key_08;
  rx_vec_i128 key_09;
  rx_vec_i128 key_10;
  rx_vec_i128 key_11;
  rx_vec_i128 key_12;
  rx_vec_i128 key_13;
  rx_vec_i128 key_14;
  rx_vec_i128 alVar23;
  void *pvVar3;
  
  uVar19 = *fill_state;
  uVar20 = *(undefined4 *)((long)fill_state + 4);
  uVar21 = *(undefined4 *)((long)fill_state + 8);
  uVar22 = *(undefined4 *)((long)fill_state + 0xc);
  uVar15 = *(undefined4 *)((long)fill_state + 0x10);
  uVar16 = *(undefined4 *)((long)fill_state + 0x14);
  uVar17 = *(undefined4 *)((long)fill_state + 0x18);
  uVar18 = *(undefined4 *)((long)fill_state + 0x1c);
  uVar11 = *(undefined4 *)((long)fill_state + 0x20);
  uVar12 = *(undefined4 *)((long)fill_state + 0x24);
  uVar13 = *(undefined4 *)((long)fill_state + 0x28);
  uVar14 = *(undefined4 *)((long)fill_state + 0x2c);
  uVar7 = *(undefined4 *)((long)fill_state + 0x30);
  uVar8 = *(undefined4 *)((long)fill_state + 0x34);
  uVar9 = *(undefined4 *)((long)fill_state + 0x38);
  uVar10 = *(undefined4 *)((long)fill_state + 0x3c);
  puVar5 = (undefined4 *)((long)scratchpad + (scratchpadSize - 0x1000));
  pvVar2 = fill_state;
  pvVar3 = hash;
  puVar6 = (undefined4 *)scratchpad;
  bVar1 = true;
  do {
    for (; bVar4 = bVar1, puVar6 < puVar5; puVar6 = puVar6 + 0x10) {
      in[1] = scratchpadSize;
      in[0] = (longlong)scratchpad;
      key[1] = (longlong)pvVar2;
      key[0] = (longlong)pvVar3;
      alVar23 = soft_aesenc(in,key);
      key_00[0] = alVar23[1];
      in_00[1] = scratchpadSize;
      in_00[0] = (longlong)scratchpad;
      key_00[1] = (longlong)pvVar2;
      alVar23 = soft_aesdec(in_00,key_00);
      key_01[0] = alVar23[1];
      in_01[1] = scratchpadSize;
      in_01[0] = (longlong)scratchpad;
      key_01[1] = (longlong)pvVar2;
      alVar23 = soft_aesenc(in_01,key_01);
      key_02[0] = alVar23[1];
      in_02[1] = scratchpadSize;
      in_02[0] = (longlong)scratchpad;
      key_02[1] = (longlong)pvVar2;
      alVar23 = soft_aesdec(in_02,key_02);
      key_03[0] = alVar23[1];
      in_03[1] = scratchpadSize;
      in_03[0] = (longlong)scratchpad;
      key_03[1] = (longlong)pvVar2;
      alVar23 = soft_aesdec(in_03,key_03);
      key_04[0] = alVar23[1];
      in_04[1] = scratchpadSize;
      in_04[0] = (longlong)scratchpad;
      key_04[1] = (longlong)pvVar2;
      alVar23 = soft_aesenc(in_04,key_04);
      key_05[0] = alVar23[1];
      in_05[1] = scratchpadSize;
      in_05[0] = (longlong)scratchpad;
      key_05[1] = (longlong)pvVar2;
      alVar23 = soft_aesdec(in_05,key_05);
      key_06[0] = alVar23[1];
      in_06[1] = scratchpadSize;
      in_06[0] = (longlong)scratchpad;
      key_06[1] = (longlong)pvVar2;
      alVar23 = soft_aesenc(in_06,key_06);
      pvVar3 = alVar23[1];
      *puVar6 = extraout_XMM0_Da;
      puVar6[1] = extraout_XMM0_Db;
      puVar6[2] = extraout_XMM0_Dc;
      puVar6[3] = extraout_XMM0_Dd;
      puVar6[4] = extraout_XMM0_Da_00;
      puVar6[5] = extraout_XMM0_Db_00;
      puVar6[6] = extraout_XMM0_Dc_00;
      puVar6[7] = extraout_XMM0_Dd_00;
      puVar6[8] = extraout_XMM0_Da_01;
      puVar6[9] = extraout_XMM0_Db_01;
      puVar6[10] = extraout_XMM0_Dc_01;
      puVar6[0xb] = extraout_XMM0_Dd_01;
      puVar6[0xc] = extraout_XMM0_Da_02;
      puVar6[0xd] = extraout_XMM0_Db_02;
      puVar6[0xe] = extraout_XMM0_Dc_02;
      puVar6[0xf] = extraout_XMM0_Dd_02;
      uVar7 = extraout_XMM0_Da_02;
      uVar8 = extraout_XMM0_Db_02;
      uVar9 = extraout_XMM0_Dc_02;
      uVar10 = extraout_XMM0_Dd_02;
      uVar11 = extraout_XMM0_Da_01;
      uVar12 = extraout_XMM0_Db_01;
      uVar13 = extraout_XMM0_Dc_01;
      uVar14 = extraout_XMM0_Dd_01;
      uVar15 = extraout_XMM0_Da_00;
      uVar16 = extraout_XMM0_Db_00;
      uVar17 = extraout_XMM0_Dc_00;
      uVar18 = extraout_XMM0_Dd_00;
      uVar19 = extraout_XMM0_Da;
      uVar20 = extraout_XMM0_Db;
      uVar21 = extraout_XMM0_Dc;
      uVar22 = extraout_XMM0_Dd;
      bVar1 = bVar4;
    }
    puVar5 = puVar5 + 0x400;
    bVar1 = false;
  } while (bVar4);
  *(undefined4 *)fill_state = uVar19;
  *(undefined4 *)((long)fill_state + 4) = uVar20;
  *(undefined4 *)((long)fill_state + 8) = uVar21;
  *(undefined4 *)((long)fill_state + 0xc) = uVar22;
  *(undefined4 *)((long)fill_state + 0x10) = uVar15;
  *(undefined4 *)((long)fill_state + 0x14) = uVar16;
  *(undefined4 *)((long)fill_state + 0x18) = uVar17;
  *(undefined4 *)((long)fill_state + 0x1c) = uVar18;
  *(undefined4 *)((long)fill_state + 0x20) = uVar11;
  *(undefined4 *)((long)fill_state + 0x24) = uVar12;
  *(undefined4 *)((long)fill_state + 0x28) = uVar13;
  *(undefined4 *)((long)fill_state + 0x2c) = uVar14;
  *(undefined4 *)((long)fill_state + 0x30) = uVar7;
  *(undefined4 *)((long)fill_state + 0x34) = uVar8;
  *(undefined4 *)((long)fill_state + 0x38) = uVar9;
  *(undefined4 *)((long)fill_state + 0x3c) = uVar10;
  alVar23[1] = scratchpadSize;
  alVar23[0] = (longlong)scratchpad;
  key_07[1] = (longlong)pvVar2;
  key_07[0] = (longlong)pvVar3;
  alVar23 = soft_aesenc(alVar23,key_07);
  key_08[0] = alVar23[1];
  in_07[1] = scratchpadSize;
  in_07[0] = (longlong)scratchpad;
  key_08[1] = (longlong)pvVar2;
  alVar23 = soft_aesdec(in_07,key_08);
  key_09[0] = alVar23[1];
  in_08[1] = scratchpadSize;
  in_08[0] = (longlong)scratchpad;
  key_09[1] = (longlong)pvVar2;
  alVar23 = soft_aesenc(in_08,key_09);
  key_10[0] = alVar23[1];
  in_09[1] = scratchpadSize;
  in_09[0] = (longlong)scratchpad;
  key_10[1] = (longlong)pvVar2;
  alVar23 = soft_aesdec(in_09,key_10);
  key_11[0] = alVar23[1];
  in_10[1] = scratchpadSize;
  in_10[0] = (longlong)scratchpad;
  key_11[1] = (longlong)pvVar2;
  alVar23 = soft_aesenc(in_10,key_11);
  key_12[0] = alVar23[1];
  in_11[1] = scratchpadSize;
  in_11[0] = (longlong)scratchpad;
  key_12[1] = (longlong)pvVar2;
  alVar23 = soft_aesdec(in_11,key_12);
  key_13[0] = alVar23[1];
  in_12[1] = scratchpadSize;
  in_12[0] = (longlong)scratchpad;
  key_13[1] = (longlong)pvVar2;
  alVar23 = soft_aesenc(in_12,key_13);
  key_14[0] = alVar23[1];
  in_13[1] = scratchpadSize;
  in_13[0] = (longlong)scratchpad;
  key_14[1] = (longlong)pvVar2;
  soft_aesdec(in_13,key_14);
  *(ulong *)hash = CONCAT44(extraout_XMM0_Db_03,extraout_XMM0_Da_03);
  *(ulong *)((long)hash + 8) = CONCAT44(extraout_XMM0_Dd_03,extraout_XMM0_Dc_03);
  *(ulong *)((long)hash + 0x10) = CONCAT44(extraout_XMM0_Db_04,extraout_XMM0_Da_04);
  *(ulong *)((long)hash + 0x18) = CONCAT44(extraout_XMM0_Dd_04,extraout_XMM0_Dc_04);
  *(ulong *)((long)hash + 0x20) = CONCAT44(extraout_XMM0_Db_05,extraout_XMM0_Da_05);
  *(ulong *)((long)hash + 0x28) = CONCAT44(extraout_XMM0_Dd_05,extraout_XMM0_Dc_05);
  *(undefined4 *)((long)hash + 0x30) = extraout_XMM0_Da_06;
  *(undefined4 *)((long)hash + 0x34) = extraout_XMM0_Db_06;
  *(undefined4 *)((long)hash + 0x38) = extraout_XMM0_Dc_06;
  *(undefined4 *)((long)hash + 0x3c) = extraout_XMM0_Dd_06;
  return;
}

Assistant:

void hashAndFillAes1Rx4(void *scratchpad, size_t scratchpadSize, void *hash, void* fill_state) {
	uint8_t* scratchpadPtr = (uint8_t*)scratchpad;
	const uint8_t* scratchpadEnd = scratchpadPtr + scratchpadSize;

	// initial state
	rx_vec_i128 hash_state0 = rx_set_int_vec_i128(AES_HASH_1R_STATE0);
	rx_vec_i128 hash_state1 = rx_set_int_vec_i128(AES_HASH_1R_STATE1);
	rx_vec_i128 hash_state2 = rx_set_int_vec_i128(AES_HASH_1R_STATE2);
	rx_vec_i128 hash_state3 = rx_set_int_vec_i128(AES_HASH_1R_STATE3);

	const rx_vec_i128 key0 = rx_set_int_vec_i128(AES_GEN_1R_KEY0);
	const rx_vec_i128 key1 = rx_set_int_vec_i128(AES_GEN_1R_KEY1);
	const rx_vec_i128 key2 = rx_set_int_vec_i128(AES_GEN_1R_KEY2);
	const rx_vec_i128 key3 = rx_set_int_vec_i128(AES_GEN_1R_KEY3);

	rx_vec_i128 fill_state0 = rx_load_vec_i128((rx_vec_i128*)fill_state + 0);
	rx_vec_i128 fill_state1 = rx_load_vec_i128((rx_vec_i128*)fill_state + 1);
	rx_vec_i128 fill_state2 = rx_load_vec_i128((rx_vec_i128*)fill_state + 2);
	rx_vec_i128 fill_state3 = rx_load_vec_i128((rx_vec_i128*)fill_state + 3);

	constexpr int PREFETCH_DISTANCE = 4096;
	const char* prefetchPtr = ((const char*)scratchpad) + PREFETCH_DISTANCE;
	scratchpadEnd -= PREFETCH_DISTANCE;

	for (int i = 0; i < 2; ++i) {
		//process 64 bytes at a time in 4 lanes
		while (scratchpadPtr < scratchpadEnd) {
			hash_state0 = aesenc<softAes>(hash_state0, rx_load_vec_i128((rx_vec_i128*)scratchpadPtr + 0));
			hash_state1 = aesdec<softAes>(hash_state1, rx_load_vec_i128((rx_vec_i128*)scratchpadPtr + 1));
			hash_state2 = aesenc<softAes>(hash_state2, rx_load_vec_i128((rx_vec_i128*)scratchpadPtr + 2));
			hash_state3 = aesdec<softAes>(hash_state3, rx_load_vec_i128((rx_vec_i128*)scratchpadPtr + 3));

			fill_state0 = aesdec<softAes>(fill_state0, key0);
			fill_state1 = aesenc<softAes>(fill_state1, key1);
			fill_state2 = aesdec<softAes>(fill_state2, key2);
			fill_state3 = aesenc<softAes>(fill_state3, key3);

			rx_store_vec_i128((rx_vec_i128*)scratchpadPtr + 0, fill_state0);
			rx_store_vec_i128((rx_vec_i128*)scratchpadPtr + 1, fill_state1);
			rx_store_vec_i128((rx_vec_i128*)scratchpadPtr + 2, fill_state2);
			rx_store_vec_i128((rx_vec_i128*)scratchpadPtr + 3, fill_state3);

			rx_prefetch_t0(prefetchPtr);

			scratchpadPtr += 64;
			prefetchPtr += 64;
		}
		prefetchPtr = (const char*) scratchpad;
		scratchpadEnd += PREFETCH_DISTANCE;
	}

	rx_store_vec_i128((rx_vec_i128*)fill_state + 0, fill_state0);
	rx_store_vec_i128((rx_vec_i128*)fill_state + 1, fill_state1);
	rx_store_vec_i128((rx_vec_i128*)fill_state + 2, fill_state2);
	rx_store_vec_i128((rx_vec_i128*)fill_state + 3, fill_state3);

	//two extra rounds to achieve full diffusion
	rx_vec_i128 xkey0 = rx_set_int_vec_i128(AES_HASH_1R_XKEY0);
	rx_vec_i128 xkey1 = rx_set_int_vec_i128(AES_HASH_1R_XKEY1);

	hash_state0 = aesenc<softAes>(hash_state0, xkey0);
	hash_state1 = aesdec<softAes>(hash_state1, xkey0);
	hash_state2 = aesenc<softAes>(hash_state2, xkey0);
	hash_state3 = aesdec<softAes>(hash_state3, xkey0);

	hash_state0 = aesenc<softAes>(hash_state0, xkey1);
	hash_state1 = aesdec<softAes>(hash_state1, xkey1);
	hash_state2 = aesenc<softAes>(hash_state2, xkey1);
	hash_state3 = aesdec<softAes>(hash_state3, xkey1);

	//output hash
	rx_store_vec_i128((rx_vec_i128*)hash + 0, hash_state0);
	rx_store_vec_i128((rx_vec_i128*)hash + 1, hash_state1);
	rx_store_vec_i128((rx_vec_i128*)hash + 2, hash_state2);
	rx_store_vec_i128((rx_vec_i128*)hash + 3, hash_state3);
}